

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yin.c
# Opt level: O3

void yin_write(yin_t *pe,int16 *frame)

{
  ushort uVar1;
  int iVar2;
  fixed32 *pfVar3;
  byte bVar4;
  undefined4 uVar5;
  byte bVar6;
  byte bVar7;
  ulong uVar8;
  byte bVar9;
  uint uVar10;
  ulong uVar11;
  uint16 uVar12;
  int iVar13;
  undefined4 uVar14;
  uint uVar15;
  uint uVar16;
  uint32 dshift;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  int16 *piVar20;
  ulong uVar21;
  ulong uVar22;
  
  bVar6 = pe->wstart + 1;
  iVar13 = 0;
  bVar7 = bVar6;
  if (bVar6 == pe->wsize) {
    bVar7 = 0;
  }
  pe->wstart = bVar7;
  uVar1 = pe->frame_size;
  uVar21 = (ulong)(uint)(uVar1 >> 1);
  pfVar3 = pe->diff_window[(ulong)bVar6 - 1];
  *pfVar3 = 0x8000;
  do {
    if (((uint)(uVar1 >> 1) << ((byte)iVar13 & 0x1f) & 0x80000000) != 0) goto LAB_00105163;
    iVar13 = iVar13 + 1;
  } while (iVar13 != 0x20);
  iVar13 = 0x20;
LAB_00105163:
  if (3 < uVar1) {
    bVar7 = (char)iVar13 - 1;
    uVar22 = 1;
    uVar19 = 1L << (bVar7 & 0x3f);
    piVar20 = frame + 1;
    uVar16 = 0;
    uVar18 = 0;
    do {
      uVar8 = 0;
      uVar17 = 0;
      uVar11 = 0;
      do {
        uVar17 = uVar17 + (uVar19 < uVar11);
        bVar9 = (byte)uVar17;
        uVar10 = ((uint)(((int)frame[uVar8] - (int)piVar20[uVar8]) *
                        ((int)frame[uVar8] - (int)piVar20[uVar8])) >> (bVar9 & 0x1f)) +
                 ((uint)uVar11 >> (uVar19 < uVar11));
        uVar11 = (ulong)uVar10;
        uVar8 = uVar8 + 1;
      } while (uVar21 != uVar8);
      bVar4 = (char)uVar18 - bVar9;
      uVar15 = uVar10 >> (bVar4 & 0x1f);
      if (uVar18 < uVar17) {
        uVar15 = uVar10 << (-bVar4 & 0x1f);
      }
      uVar15 = uVar15 + uVar16;
      uVar8 = (ulong)uVar15;
      if (uVar19 < uVar8) {
        do {
          uVar8 = uVar8 >> 1;
          uVar15 = (uint)uVar8;
          uVar18 = uVar18 + 1;
        } while ((uint)uVar19 < uVar15);
      }
      uVar16 = uVar15 + (uVar15 == 0);
      pfVar3[uVar22] =
           (fixed32)(((ulong)(uint)((int)uVar22 << (bVar7 & 0x1f)) / (ulong)uVar16) * uVar11 >>
                    ((((char)iVar13 + -0x10) - bVar9) + (char)uVar18 & 0x3f));
      uVar22 = uVar22 + 1;
      piVar20 = piVar20 + 1;
    } while (uVar22 != uVar21);
  }
  if (uVar1 < 2) {
    uVar12 = 0;
  }
  else {
    iVar13 = 0x7fffffff;
    uVar19 = 0;
    uVar14 = 0;
    do {
      iVar2 = pfVar3[uVar19];
      if (iVar2 < (int)(uint)pe->search_threshold) {
        uVar12 = (uint16)uVar19;
        break;
      }
      uVar5 = (int)uVar19;
      if (iVar13 <= iVar2) {
        uVar5 = uVar14;
      }
      uVar14 = uVar5;
      uVar12 = (uint16)uVar14;
      if (iVar2 < iVar13) {
        iVar13 = iVar2;
      }
      uVar19 = uVar19 + 1;
    } while (uVar21 != uVar19);
  }
  pe->period_window[(ulong)bVar6 - 1] = uVar12;
  pe->nfr = pe->nfr + 1;
  return;
}

Assistant:

void
yin_write(yin_t *pe, int16 const *frame)
{
    int outptr, difflen;

    /* Rotate the window one frame forward. */
    ++pe->wstart;
    /* Fill in the frame before wstart. */
    outptr = pe->wstart - 1;
    /* Wrap around the window pointer. */
    if (pe->wstart == pe->wsize)
        pe->wstart = 0;

    /* Now calculate normalized difference function. */
    difflen = pe->frame_size / 2;
    cmn_diff(frame, pe->diff_window[outptr], difflen);

    /* Find the first point under threshold.  If not found, then
     * use the absolute minimum. */
    pe->period_window[outptr]
        = thresholded_search(pe->diff_window[outptr],
                             pe->search_threshold, 0, difflen);

    /* Increment total number of frames. */
    ++pe->nfr;
}